

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.hpp
# Opt level: O1

void __thiscall CaDiCaL::External::check_solution_on_learned_unit_clause(External *this,int unit)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  char cVar6;
  
  uVar4 = (ulong)(uint)-unit;
  if (0 < unit) {
    uVar4 = (ulong)(uint)unit;
  }
  uVar5 = (this->internal->i2e).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4];
  uVar2 = uVar5;
  if ((int)uVar5 < 1) {
    uVar2 = -uVar5;
  }
  uVar3 = -uVar5;
  if (-1 < unit) {
    uVar3 = uVar5;
  }
  uVar5 = 0;
  if ((int)uVar2 <= this->max_var) {
    cVar1 = this->solution[uVar2];
    if (cVar1 != '\0') {
      cVar6 = -cVar1;
      if (-1 < (int)uVar3) {
        cVar6 = cVar1;
      }
      uVar5 = -uVar3;
      if ('\0' < cVar6) {
        uVar5 = uVar3;
      }
    }
  }
  if (uVar5 == unit) {
    return;
  }
  fatal("learned unit %d contradicts solution");
  return;
}

Assistant:

int externalize (int lit) {
    assert (lit != INT_MIN);
    const int idx = abs (lit);
    assert (idx);
    assert (idx <= max_var);
    int res = i2e[idx];
    if (lit < 0)
      res = -res;
    return res;
  }